

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O3

Aig_Man_t * Cec_ComputeChoices(Gia_Man_t *pGia,Dch_Pars_t *pPars)

{
  long lVar1;
  Gia_Man_t *pGVar2;
  Aig_Man_t *pAVar3;
  Cec_ParChc_t ParsChc;
  Cec_ParChc_t local_34;
  
  if (pPars->fVerbose != 0) {
    lVar1 = pPars->timeSynth;
    pGVar2 = pGia;
    Abc_Print((int)pGia,"%s =","Synthesis time");
    Abc_Print((int)pGVar2,"%9.2f sec\n",(double)lVar1 / 1000000.0);
  }
  Cec_ManChcSetDefaultParams(&local_34);
  local_34.nBTLimit = pPars->nBTLimit;
  local_34.fUseCSat = pPars->fUseCSat;
  if (100 < local_34.nBTLimit && local_34.fUseCSat != 0) {
    local_34.nBTLimit = 100;
  }
  local_34.fVerbose = pPars->fVerbose;
  Cec_ManChoiceComputation_int(pGia,&local_34);
  pGVar2 = Gia_ManEquivToChoices(pGia,3);
  Gia_ManSetRegNum(pGVar2,pGVar2->nRegs);
  pAVar3 = Gia_ManToAig(pGVar2,1);
  Gia_ManStop(pGVar2);
  return pAVar3;
}

Assistant:

Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars )
{
    Cec_ParChc_t ParsChc, * pParsChc = &ParsChc;
    Aig_Man_t * pAig;
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Synthesis time", pPars->timeSynth );
    Cec_ManChcSetDefaultParams( pParsChc );
    pParsChc->nBTLimit = pPars->nBTLimit;
    pParsChc->fUseCSat = pPars->fUseCSat;
    if ( pParsChc->fUseCSat && pParsChc->nBTLimit > 100 )
        pParsChc->nBTLimit = 100;
    pParsChc->fVerbose = pPars->fVerbose;
    pGia = Cec_ManChoiceComputationVec( pGia, 3, pParsChc );
    Gia_ManSetRegNum( pGia, Gia_ManRegNum(pGia) );
    pAig = Gia_ManToAig( pGia, 1 );
    Gia_ManStop( pGia );
    return pAig;
}